

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

CFeeRate __thiscall
CBlockPolicyEstimator::estimateRawFee
          (CBlockPolicyEstimator *this,int confTarget,double successThreshold,
          FeeEstimateHorizon horizon,EstimationResult *result)

{
  long lVar1;
  uint uVar2;
  int in_EDX;
  uint in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double __x;
  double median;
  double sufficientTxs;
  TxConfirmStats *stats;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  EstimationResult *in_stack_000000f8;
  uint in_stack_00000104;
  double in_stack_00000108;
  double in_stack_00000110;
  TxConfirmStats *in_stack_00000118;
  int in_stack_000001fc;
  TxConfirmStats *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 fTry;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  pointer local_50;
  CAmount local_20;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffff78 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (pointer)0x0;
  if (in_EDX == 0) {
    local_50 = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::get
                         ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                          in_stack_ffffffffffffff58);
  }
  else if (in_EDX == 1) {
    local_50 = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::get
                         ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                          in_stack_ffffffffffffff58);
  }
  else if (in_EDX == 2) {
    local_50 = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::get
                         ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                          in_stack_ffffffffffffff58);
  }
  if (local_50 != (pointer)0x0) {
    MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff58);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffff88),in_RDI,
               in_stack_ffffffffffffff7c,(bool)fTry);
    if (((int)in_ESI < 1) ||
       (uVar2 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff58), uVar2 < in_ESI)) {
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff58,0);
    }
    else if (in_XMM0_Qa <= 1.0) {
      __x = TxConfirmStats::EstimateMedianVal
                      (in_stack_00000118,in_stack_000001fc,in_stack_00000110,in_stack_00000108,
                       in_stack_00000104,in_stack_000000f8);
      if (0.0 <= __x) {
        llround(__x);
        CFeeRate::CFeeRate<long_long>((CFeeRate *)in_stack_ffffffffffffff58,0x122e47d);
      }
      else {
        CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff58,0);
      }
    }
    else {
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff58,0);
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return (CFeeRate)local_20;
  }
  __assert_fail("stats",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                ,0x2e6,
                "CFeeRate CBlockPolicyEstimator::estimateRawFee(int, double, FeeEstimateHorizon, EstimationResult *) const"
               );
}

Assistant:

CFeeRate CBlockPolicyEstimator::estimateRawFee(int confTarget, double successThreshold, FeeEstimateHorizon horizon, EstimationResult* result) const
{
    TxConfirmStats* stats = nullptr;
    double sufficientTxs = SUFFICIENT_FEETXS;
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        stats = shortStats.get();
        sufficientTxs = SUFFICIENT_TXS_SHORT;
        break;
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        stats = feeStats.get();
        break;
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        stats = longStats.get();
        break;
    }
    } // no default case, so the compiler can warn about missing cases
    assert(stats);

    LOCK(m_cs_fee_estimator);
    // Return failure if trying to analyze a target we're not tracking
    if (confTarget <= 0 || (unsigned int)confTarget > stats->GetMaxConfirms())
        return CFeeRate(0);
    if (successThreshold > 1)
        return CFeeRate(0);

    double median = stats->EstimateMedianVal(confTarget, sufficientTxs, successThreshold, nBestSeenHeight, result);

    if (median < 0)
        return CFeeRate(0);

    return CFeeRate(llround(median));
}